

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object3D.h
# Opt level: O1

void __thiscall
Triangle::Triangle(Triangle *this,Vector3f *a,Vector3f *b,Vector3f *c,Vector3f *na,Vector3f *nb,
                  Vector3f *nc,Material *m)

{
  long lVar1;
  
  (this->super_Object3D).type._M_dataplus._M_p = (pointer)&(this->super_Object3D).type.field_2;
  (this->super_Object3D).type._M_string_length = 0;
  (this->super_Object3D).type.field_2._M_local_buf[0] = '\0';
  (this->super_Object3D).material = m;
  (this->super_Object3D)._vptr_Object3D = (_func_int **)&PTR__Object3D_0013fae0;
  lVar1 = 0x30;
  do {
    Vector3f::Vector3f((Vector3f *)((long)&(this->super_Object3D)._vptr_Object3D + lVar1),0.0);
    lVar1 = lVar1 + 0xc;
  } while (lVar1 != 0x54);
  lVar1 = 0;
  do {
    Vector3f::Vector3f((Vector3f *)(&this->field_0x54 + lVar1),0.0);
    lVar1 = lVar1 + 0xc;
  } while (lVar1 != 0x24);
  Vector3f::operator=((Vector3f *)&this->field_0x30,a);
  Vector3f::operator=((Vector3f *)&this->field_0x3c,b);
  Vector3f::operator=((Vector3f *)&this->field_0x48,c);
  Vector3f::operator=((Vector3f *)&this->field_0x54,na);
  Vector3f::operator=((Vector3f *)&this->field_0x60,nb);
  Vector3f::operator=((Vector3f *)&this->field_0x6c,nc);
  return;
}

Assistant:

Triangle(const Vector3f &a,
             const Vector3f &b,
             const Vector3f &c,
             const Vector3f &na,
             const Vector3f &nb,
             const Vector3f &nc,
             Material *m) :
            Object3D(m) {
        _v[0] = a;
        _v[1] = b;
        _v[2] = c;
        _normals[0] = na;
        _normals[1] = nb;
        _normals[2] = nc;
    }